

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O2

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>::free_all
          (pool_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_> *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = this->_block_head;
  while (pcVar2 != (char *)0x0) {
    pcVar1 = *(char **)pcVar2;
    operator_delete__(pcVar2);
    pcVar2 = pcVar1;
  }
  this->_block_head = (char *)0x0;
  this->_raw_head = (char *)0x0;
  this->_blocks_count = 0;
  this->_free_head = (char *)0x0;
  this->_raw_end = (char *)0x0;
  return;
}

Assistant:

void free_all()
  {
    void *p = _block_head, *tmp = nullptr;
    while (p != nullptr) {
      tmp = p;
      p = nextblock(p);
      delete[] static_cast<char *>(tmp);
    }
    _blocks_count = 0;
    _free_head = nullptr; // _free_head_lock access protection useless
    _block_head = nullptr;
    _raw_head = nullptr;
    _raw_end = nullptr;
  }